

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall ExprVisitorTest::ExprVisitorTest(ExprVisitorTest *this)

{
  Reference RVar1;
  LogicalConstant LVar2;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExprVisitorTest_001e1028;
  (this->factory_)._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_001e4200;
  (this->factory_).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->factory_).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->factory_).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->factory_).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->factory_).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->factory_).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testing::StrictMock<MockVisitor>::StrictMock(&this->visitor_);
  (this->var_).super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (Impl *)0x0;
  (this->false_).super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_ =
       (Impl *)0x0;
  operator_delete(testing::DefaultValue<TestResult>::value_,1);
  testing::DefaultValue<TestResult>::value_ = operator_new(1);
  operator_delete(testing::DefaultValue<TestResult>::value_,1);
  testing::DefaultValue<TestResult>::value_ = operator_new(1);
  RVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeReference
                    (&this->factory_,FIRST_REFERENCE,0);
  (this->var_).super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (Impl *)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  LVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(&this->factory_,false);
  (this->false_).super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_ =
       (Impl *)LVar2.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  return;
}

Assistant:

ExprVisitorTest() {
    ::testing::DefaultValue<TestResult>::Set(TestResult(Dummy()));
    ::testing::DefaultValue<TestResult>::Set(TestResult(Dummy()));
    var_ = factory_.MakeVariable(0);
    false_ = factory_.MakeLogicalConstant(false);
  }